

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::grow
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,
          Entry *oldEntries,size_t *newMemUsed)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  Entry *pEVar8;
  Entry *key;
  Entry *local_38;
  
  local_38 = oldEntries;
  std::
  vector<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*,_std::allocator<Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::Entry_*>_>
  ::push_back(&this->_oldEntries,&local_38);
  uVar1 = this->_numEntries * 2;
  sVar5 = (ulong)uVar1 * 0x20;
  puVar3 = (ulong *)operator_new__(sVar5 + 8);
  *puVar3 = (ulong)uVar1;
  if (uVar1 != 0) {
    sVar4 = 0;
    do {
      *(undefined8 *)((long)puVar3 + sVar4 + 8) = 0;
      *(undefined4 *)((long)puVar3 + sVar4 + 0x10) = 0;
      *(undefined4 *)((long)puVar3 + sVar4 + 0x14) = 0;
      *(undefined1 *)((long)puVar3 + sVar4 + 0x18) = 0;
      *(undefined8 *)((long)puVar3 + sVar4 + 0x20) = 0;
      sVar4 = sVar4 + 0x20;
    } while (sVar5 != sVar4);
  }
  pEVar8 = (Entry *)(puVar3 + 1);
  *newMemUsed = sVar5;
  for (uVar7 = 0; uVar7 < this->_numEntries; uVar7 = uVar7 + 1) {
    if (local_38[uVar7].value != (PtexCachedReader *)0x0) {
      key = local_38 + uVar7;
      uVar2 = (key->key)._hash;
      do {
        uVar6 = (ulong)(uVar2 & uVar1 - 1);
        uVar2 = uVar2 + 1;
      } while (puVar3[uVar6 * 4 + 4] != 0);
      StringKey::move(&pEVar8[uVar6].key,&key->key);
      pEVar8[uVar6].value = key->value;
    }
  }
  this->_numEntries = uVar1;
  return pEVar8;
}

Assistant:

Entry* grow(Entry* oldEntries, size_t& newMemUsed)
    {
        _oldEntries.push_back(oldEntries);
        uint32_t numNewEntries = _numEntries*2;
        Entry* entries = new Entry[numNewEntries];
        newMemUsed = numNewEntries * sizeof(Entry);
        uint32_t mask = numNewEntries-1;
        for (uint32_t oldIndex = 0; oldIndex < _numEntries; ++oldIndex) {
            Entry& oldEntry = oldEntries[oldIndex];
            if (oldEntry.value) {
                for (int newIndex = oldEntry.key.hash();; ++newIndex) {
                    Entry& newEntry = entries[newIndex&mask];
                    if (!newEntry.value) {
                        newEntry.key.move(oldEntry.key);
                        newEntry.value = oldEntry.value;
                        break;
                    }
                }
            }
        }
        _numEntries = numNewEntries;
        return entries;
    }